

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitLdArrayBuffer(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  code *pcVar1;
  EmitExpressionInfo EVar2;
  bool bVar3;
  ParseNode *node;
  ParseNode *indexNode_00;
  AsmJsCompilationException *pAVar4;
  IdentPtr name_00;
  AsmJsSymbol *sym_00;
  LPCOLESTR pOVar5;
  AsmJsArrayView *this_00;
  undefined4 *puVar6;
  AsmJsType local_6c;
  EmitExpressionInfo local_68;
  EmitExpressionInfo indexInfo;
  uint32 indexSlot;
  OpCodeAsmJs op;
  ViewType viewType;
  AsmJsArrayView *arrayView;
  AsmJsSymbol *sym;
  PropertyName name;
  ParseNode *indexNode;
  ParseNode *arrayNameNode;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo info;
  
  node = ParserWrapper::GetBinaryLeft(pnode);
  indexNode_00 = ParserWrapper::GetBinaryRight(pnode);
  bVar3 = ParserWrapper::IsNameDeclaration(node);
  if (!bVar3) {
    pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(pAVar4,L"Invalid symbol ");
    __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
  }
  name_00 = ParseNode::name(node);
  sym_00 = AsmJsModuleCompiler::LookupIdentifier
                     (this->mCompiler,name_00,this->mFunction,(Source *)0x0);
  bVar3 = AsmJsArrayView::Is(sym_00);
  if (bVar3) {
    this_00 = AsmJsArrayView::FromSymbol(sym_00);
    indexInfo.type.which_._3_1_ = AsmJsArrayView::GetViewType(this_00);
    indexInfo.super_EmitInfoBase.location = 0;
    local_68 = EmitTypedArrayIndex(this,indexNode_00,(OpCodeAsmJs *)&indexInfo.type,
                                   (uint32 *)&indexInfo,indexInfo.type.which_._3_1_,LoadTypedArray);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_68);
    local_6c.which_ = (**(this_00->super_AsmJsSymbol)._vptr_AsmJsSymbol)();
    EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_6c);
    bVar3 = AsmJsType::isIntish((AsmJsType *)((long)&this_local + 4));
    if (bVar3) {
      this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
    }
    else {
      bVar3 = AsmJsType::isMaybeFloat((AsmJsType *)((long)&this_local + 4));
      if (bVar3) {
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
      }
      else {
        bVar3 = AsmJsType::isMaybeDouble((AsmJsType *)((long)&this_local + 4));
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x696,"(info.type.isMaybeDouble())",
                                      "info.type.isMaybeDouble()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
      }
    }
    AsmJsByteCodeWriter::AsmTypedArr
              (&this->mWriter,(undefined2)indexInfo.type.which_,this_local._0_4_,
               indexInfo.super_EmitInfoBase.location,indexInfo.type.which_._3_1_);
    EVar2.type.which_ = this_local._4_4_;
    EVar2.super_EmitInfoBase.location = this_local._0_4_;
    return EVar2;
  }
  pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  pOVar5 = Ident::Psz(name_00);
  AsmJsCompilationException::AsmJsCompilationException(pAVar4,L"Invalid identifier %s",pOVar5);
  __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitLdArrayBuffer( ParseNode * pnode )
    {
        ParseNode* arrayNameNode = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* indexNode = ParserWrapper::GetBinaryRight( pnode );
        if( !ParserWrapper::IsNameDeclaration( arrayNameNode ) )
        {
            throw AsmJsCompilationException( _u("Invalid symbol ") );
        }

        PropertyName name = arrayNameNode->name();
        AsmJsSymbol* sym = mCompiler->LookupIdentifier(name, mFunction);
        if(!AsmJsArrayView::Is(sym))
        {
            throw AsmJsCompilationException( _u("Invalid identifier %s"), name->Psz() );
        }
        AsmJsArrayView* arrayView = AsmJsArrayView::FromSymbol(sym);
        ArrayBufferView::ViewType viewType = arrayView->GetViewType();

        OpCodeAsmJs op;
        uint32 indexSlot = 0;
        EmitExpressionInfo indexInfo = EmitTypedArrayIndex(indexNode, op, indexSlot, viewType, LoadTypedArray);
        mFunction->ReleaseLocationGeneric(&indexInfo);

        EmitExpressionInfo info( arrayView->GetType() );
        if( info.type.isIntish() )
        {
            info.location = mFunction->AcquireTmpRegister<int>();
        }
        else if (info.type.isMaybeFloat())
        {
            info.location = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            Assert(info.type.isMaybeDouble());
            info.location = mFunction->AcquireTmpRegister<double>();
        }
        mWriter.AsmTypedArr( op, info.location, indexSlot, viewType );

        return info;
    }